

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

idx_t duckdb::BitStringAggOperation::GetRange<unsigned_char>(uchar min,uchar max)

{
  bool bVar1;
  idx_t iVar2;
  InvalidInputException *this;
  allocator local_41;
  uchar result;
  
  if (min <= max) {
    bVar1 = TrySubtractOperator::Operation<unsigned_char,unsigned_char,unsigned_char>
                      (max,min,&result);
    iVar2 = 0xffffffffffffffff;
    if (bVar1) {
      iVar2 = (ulong)result + 1;
    }
    return iVar2;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&result,"Invalid explicit bitstring range: Minimum (%d) > maximum (%d)",
             &local_41);
  InvalidInputException::InvalidInputException<unsigned_char,unsigned_char>
            (this,(string *)&result,min,max);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static idx_t GetRange(INPUT_TYPE min, INPUT_TYPE max) {
		if (min > max) {
			throw InvalidInputException("Invalid explicit bitstring range: Minimum (%d) > maximum (%d)", min, max);
		}
		INPUT_TYPE result;
		if (!TrySubtractOperator::Operation(max, min, result)) {
			return NumericLimits<idx_t>::Maximum();
		}
		auto val = NumericCast<idx_t>(result);
		if (val == NumericLimits<idx_t>::Maximum()) {
			return val;
		}
		return val + 1;
	}